

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

QPixmapStylePrivate * __thiscall
QPixmapStylePrivate::getCachedPixmap
          (QPixmapStylePrivate *this,ControlDescriptor control,QPixmapStyleDescriptor *desc,
          QSize *size)

{
  char *pcVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  char cVar6;
  Data *pDVar7;
  Data *pDVar8;
  undefined4 in_register_00000034;
  int *in_R8;
  Data *pDVar9;
  long in_FS_OFFSET;
  QPixmap *result;
  undefined1 local_f0 [24];
  QArrayData *local_d8;
  char16_t *pcStack_d0;
  QString *local_c8;
  QString local_b8;
  QString local_98;
  undefined1 local_78 [32];
  QArrayData *local_58;
  char16_t *pcStack_50;
  QString *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = *(undefined8 **)(CONCAT44(in_register_00000034,control) + 8);
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::number((int)&local_b8,*in_R8);
  qVar5 = local_b8.d.size;
  pcVar4 = local_b8.d.ptr;
  pDVar7 = local_b8.d.d;
  local_b8.d.size = 0;
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  QString::number((int)&local_d8,in_R8[1]);
  local_48 = local_c8;
  pcStack_50 = pcStack_d0;
  local_58 = local_d8;
  local_78._0_8_ = pDVar7;
  local_78._8_8_ = pcVar4;
  local_78._16_8_ = qVar5;
  local_78._24_2_ = L'*';
  local_d8 = (QArrayData *)0x0;
  pcStack_d0 = (char16_t *)0x0;
  local_c8 = (QString *)0x0;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
            (&local_98,(QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)local_78);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)local_78);
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)*puVar2)(puVar2);
  pDVar7 = (Data *)QMetaObject::className();
  if (pDVar7 == (Data *)0x0) {
    pDVar9 = (Data *)0x0;
  }
  else {
    pDVar8 = (Data *)0xffffffffffffffff;
    do {
      pDVar9 = (Data *)((long)&(pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                               _M_i + 1);
      pcVar1 = (undefined1 *)
               ((long)&(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1) +
               (long)pDVar8;
      pDVar8 = pDVar9;
    } while (*pcVar1 != '\0');
  }
  QString::number((int)&local_d8,(int)desc);
  local_58 = (QArrayData *)local_c8;
  local_78._24_8_ = pcStack_d0;
  local_78._16_8_ = local_d8;
  local_c8 = (QString *)0x0;
  local_d8 = (QArrayData *)0x0;
  pcStack_d0 = (char16_t *)0x0;
  pcStack_50 = (char16_t *)CONCAT62(pcStack_50._2_6_,0x40);
  local_48 = &local_98;
  local_78._0_8_ = pDVar9;
  local_78._8_8_ = pDVar7;
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>,_const_QString_&>
  ::convertTo<QString>
            (&local_b8,
             (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>,_const_QString_&>
              *)local_78);
  if ((QArrayData *)local_78._16_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._16_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._16_8_,2,0x10);
    }
  }
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,0x10);
    }
  }
  *(undefined1 **)&(this->super_QCommonStylePrivate).super_QStylePrivate.field_0x10 =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QCommonStylePrivate).super_QStylePrivate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QCommonStylePrivate).super_QStylePrivate.field_0x8 =
       &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)this);
  cVar6 = QPixmapCache::find((QString *)&local_b8,(QPixmap *)this);
  if (cVar6 == '\0') {
    local_c8 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_d0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&local_d8,size,0,0);
    scale((QPixmapStylePrivate *)local_f0,*in_R8,in_R8[1],(QPixmap *)&local_d8,
          (QPixmapStyleDescriptor *)size);
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_78);
    uVar3 = local_f0._16_8_;
    local_78._0_8_ = QDataStream::operator<<;
    local_f0._16_8_ = 0;
    local_78._16_8_ =
         *(undefined8 *)&(this->super_QCommonStylePrivate).super_QStylePrivate.field_0x10;
    *(undefined8 *)&(this->super_QCommonStylePrivate).super_QStylePrivate.field_0x10 = uVar3;
    QPixmap::~QPixmap((QPixmap *)local_78);
    QPixmap::~QPixmap((QPixmap *)local_f0);
    QPixmapCache::insert((QString *)&local_b8,(QPixmap *)this);
    QPixmap::~QPixmap((QPixmap *)&local_d8);
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QPixmap QPixmapStylePrivate::getCachedPixmap(QPixmapStyle::ControlDescriptor control,
                                             const QPixmapStyleDescriptor &desc,
                                             const QSize &size) const
{
    Q_Q(const QPixmapStyle);

    const QString sizeString = QString::number(size.width()) % u'*'
            % QString::number(size.height());
    const QString key = QLatin1StringView(q->metaObject()->className()) % QString::number(control)
            % u'@' % sizeString;

    QPixmap result;

    if (!QPixmapCache::find( key, &result)) {
        QPixmap source(desc.fileName);
        result = scale(size.width(), size.height(), source, desc);
        QPixmapCache::insert(key, result);
    }
    return result;
}